

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SlidingWindowsLayerParams::MergePartialFromCodedStream
          (SlidingWindowsLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  uint8 *puVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001453f8;
      input->buffer_ = pbVar3 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001453f8:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar11 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar5 | uVar11;
    }
    uVar5 = (uint32)uVar11;
    iVar8 = 6;
    iVar9 = iVar8;
    if ((uVar11 & 0x100000000) == 0) goto LAB_00145419;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 == 3) {
      if (cVar10 != '\x18') goto LAB_00145419;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (-1 < (long)(char)*puVar7)) {
        this->step_ = (long)(char)*puVar7;
LAB_001454c1:
        input->buffer_ = puVar7 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->step_ = pVar12.first;
LAB_001454e6:
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00145440;
      }
LAB_0014543e:
      iVar9 = 0;
    }
    else if (uVar6 == 2) {
      if (cVar10 == '\x10') {
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (-1 < (long)(char)*puVar7)) {
          this->windowsize_ = (long)(char)*puVar7;
          goto LAB_001454c1;
        }
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->windowsize_ = pVar12.first;
        goto LAB_001454e6;
      }
LAB_00145419:
      iVar9 = 7;
      if (((uVar5 & 7) != 4 && uVar5 != 0) &&
         (bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5), iVar9 = iVar8,
         bVar4)) goto LAB_0014543e;
    }
    else {
      if ((uVar6 != 1) || (cVar10 != '\b')) goto LAB_00145419;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (uVar2 = *puVar7, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar7 + 1;
        pVar12._8_8_ = 1;
        pVar12.first = (long)(char)uVar2;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->axis_ = pVar12.first;
        goto LAB_0014543e;
      }
    }
LAB_00145440:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool SlidingWindowsLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SlidingWindowsLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 windowSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &windowsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 step = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &step_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SlidingWindowsLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SlidingWindowsLayerParams)
  return false;
#undef DO_
}